

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O1

t_int * vinlet_doprolog(t_int *w)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  t_int tVar5;
  undefined4 *puVar6;
  long lVar7;
  long lVar8;
  
  lVar3 = w[1];
  lVar4 = w[2];
  tVar5 = w[3];
  puVar6 = *(undefined4 **)(lVar3 + 0x58);
  if (puVar6 == *(undefined4 **)(lVar3 + 0x50)) {
    iVar1 = *(int *)(lVar3 + 0x68);
    iVar2 = *(int *)(lVar3 + 0x40);
    puVar6 = puVar6 + -(long)iVar1;
    if (iVar2 != iVar1) {
      lVar7 = *(long *)(lVar3 + 0x48);
      lVar8 = 0;
      do {
        *(undefined4 *)(lVar7 + lVar8 * 4) = *(undefined4 *)(lVar7 + (long)iVar1 * 4 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (iVar2 - iVar1 != (int)lVar8);
    }
  }
  if ((int)tVar5 != 0) {
    lVar7 = 0;
    do {
      *puVar6 = *(undefined4 *)(lVar4 + lVar7 * 4);
      puVar6 = puVar6 + 1;
      lVar7 = lVar7 + 1;
    } while ((int)tVar5 != (int)lVar7);
  }
  *(undefined4 **)(lVar3 + 0x58) = puVar6;
  return w + 4;
}

Assistant:

t_int *vinlet_doprolog(t_int *w)
{
    t_vinlet *x = (t_vinlet *)(w[1]);
    t_sample *in = (t_sample *)(w[2]);
    int n = (int)(w[3]);
    t_sample *out = x->x_fill;
    if (out == x->x_endbuf)
    {
        t_sample *f1 = x->x_buf, *f2 = x->x_buf + x->x_hop;
        int nshift = x->x_bufsize - x->x_hop;
        out -= x->x_hop;
        while (nshift--) *f1++ = *f2++;
    }

    while (n--) *out++ = *in++;
    x->x_fill = out;
    return (w+4);
}